

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O3

void batch_del(MppDevBatServ *server,MppDevBatTask *batch)

{
  list_head *plVar1;
  list_head *plVar2;
  undefined8 in_RAX;
  undefined8 uVar3;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  if (batch == (MppDevBatTask *)0x0) {
    uVar3 = CONCAT44(uVar4,0xce);
    _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch","batch_del",uVar3
              );
    uVar4 = (undefined4)((ulong)uVar3 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0011e575;
  }
  if (batch->fill_cnt != 0) {
    uVar3 = CONCAT44(uVar4,0xcf);
    _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch->fill_cnt == 0",
               "batch_del",uVar3);
    uVar4 = (undefined4)((ulong)uVar3 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0011e575;
  }
  if ((batch->link_tasks).next != &batch->link_tasks) {
    _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
               "list_empty(&batch->link_tasks)","batch_del",CONCAT44(uVar4,0xd0));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0011e575:
      abort();
    }
  }
  plVar1 = (batch->link_server).next;
  plVar2 = (batch->link_server).prev;
  plVar1->prev = plVar2;
  plVar2->next = plVar1;
  (batch->link_server).next = &batch->link_server;
  (batch->link_server).prev = &batch->link_server;
  mpp_mem_pool_put_f("batch_del",server->batch_pool,batch);
  server->batch_free = server->batch_free + -1;
  if (((byte)mpp_server_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"mpp_server","batch del free count %d:%d\n",(char *)0x0,
             (ulong)(uint)server->batch_run);
  return;
}

Assistant:

void batch_del(MppDevBatServ *server, MppDevBatTask *batch)
{
    mpp_assert(batch);
    mpp_assert(batch->fill_cnt == 0);
    mpp_assert(list_empty(&batch->link_tasks));

    list_del_init(&batch->link_server);

    mpp_mem_pool_put(server->batch_pool, batch);
    server->batch_free--;
    mpp_serv_dbg_flow("batch del free count %d:%d\n", server->batch_run, server->batch_free);
}